

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1a3093::AV1QuantizeTest_QuantizeFpNoQmatrix_Test::TestBody
          (AV1QuantizeTest_QuantizeFpNoQmatrix_Test *this)

{
  undefined8 *puVar1;
  pointer *__ptr;
  SEARCH_METHODS *pSVar2;
  long lVar3;
  Message local_c8;
  AssertHelper local_c0;
  internal local_b8 [8];
  undefined8 *local_b0;
  int eob;
  int16_t quant_ptr [2];
  int16_t round_ptr [2];
  int16_t dequant_ptr [2];
  tran_low_t dqcoeff_ptr [4];
  tran_low_t qcoeff_ptr [4];
  tran_low_t ref_dqcoeff_ptr [4];
  tran_low_t ref_qcoeff_ptr [4];
  int16_t scan [4];
  tran_low_t coeff_ptr [4];
  
  dequant_ptr[0] = 0x4e;
  dequant_ptr[1] = 0x5d;
  round_ptr[0] = 0x27;
  round_ptr[1] = 0x2e;
  quant_ptr[0] = 0x348;
  quant_ptr[1] = 0x2c0;
  coeff_ptr[0] = -0x1c1;
  coeff_ptr[1] = 0x270;
  coeff_ptr[2] = -0xe;
  coeff_ptr[3] = 0x18;
  ref_qcoeff_ptr[0] = -6;
  ref_qcoeff_ptr[1] = 7;
  ref_qcoeff_ptr[2] = 0;
  ref_qcoeff_ptr[3] = 0;
  ref_dqcoeff_ptr[0] = -0x1d4;
  ref_dqcoeff_ptr[1] = 0x28b;
  ref_dqcoeff_ptr[2] = 0;
  ref_dqcoeff_ptr[3] = 0;
  scan[0] = 0;
  scan[1] = 1;
  scan[2] = 2;
  scan[3] = 3;
  eob = av1_quantize_fp_no_qmatrix
                  (quant_ptr,dequant_ptr,round_ptr,0,scan,4,coeff_ptr,qcoeff_ptr,dqcoeff_ptr);
  local_c8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>(local_b8,"eob","2",&eob,(int *)&local_c8);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message(&local_c8);
    if (local_b0 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_b0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_quantize_test.cc"
               ,0xe3,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((long *)CONCAT44(local_c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  puVar1 = local_b0;
  if (local_b0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_b0 != local_b0 + 2) {
      operator_delete((undefined8 *)*local_b0);
    }
    operator_delete(puVar1);
  }
  lVar3 = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>
              (local_b8,"qcoeff_ptr[i]","ref_qcoeff_ptr[i]",(int *)((long)qcoeff_ptr + lVar3),
               (int *)((long)ref_qcoeff_ptr + lVar3));
    if (local_b8[0] == (internal)0x0) {
      testing::Message::Message(&local_c8);
      pSVar2 = "";
      if (local_b0 != (undefined8 *)0x0) {
        pSVar2 = (SEARCH_METHODS *)*local_b0;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_quantize_test.cc"
                 ,0xe5,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_c0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if ((long *)CONCAT44(local_c8.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_c8.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_c8.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_c8.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    puVar1 = local_b0;
    if (local_b0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_b0 != local_b0 + 2) {
        operator_delete((undefined8 *)*local_b0);
      }
      operator_delete(puVar1);
    }
    testing::internal::CmpHelperEQ<int,int>
              (local_b8,"dqcoeff_ptr[i]","ref_dqcoeff_ptr[i]",(int *)((long)dqcoeff_ptr + lVar3),
               (int *)((long)ref_dqcoeff_ptr + lVar3));
    if (local_b8[0] == (internal)0x0) {
      testing::Message::Message(&local_c8);
      pSVar2 = "";
      if (local_b0 != (undefined8 *)0x0) {
        pSVar2 = (SEARCH_METHODS *)*local_b0;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_quantize_test.cc"
                 ,0xe6,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_c0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if ((long *)CONCAT44(local_c8.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_c8.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_c8.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_c8.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    puVar1 = local_b0;
    if (local_b0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_b0 != local_b0 + 2) {
        operator_delete((undefined8 *)*local_b0);
      }
      operator_delete(puVar1);
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  return;
}

Assistant:

TEST(AV1QuantizeTest, QuantizeFpNoQmatrix) {
  // Here we use a uniform quantizer as an example
  const int16_t dequant_ptr[2] = { 78, 93 };  // quantize step
  const int16_t round_ptr[2] = { 39, 46 };    // round ~= dequant / 2

  // quant ~= 2^16 / dequant. This is a 16-bit fixed point representation of the
  // inverse of quantize step.
  const int16_t quant_ptr[2] = { 840, 704 };
  int log_scale = 0;
  int coeff_count = 4;
  const tran_low_t coeff_ptr[4] = { -449, 624, -14, 24 };
  const tran_low_t ref_qcoeff_ptr[4] = { -6, 7, 0, 0 };
  const tran_low_t ref_dqcoeff_ptr[4] = { -468, 651, 0, 0 };
  const int16_t scan[4] = { 0, 1, 2, 3 };
  tran_low_t qcoeff_ptr[4];
  tran_low_t dqcoeff_ptr[4];
  int eob = av1_quantize_fp_no_qmatrix(quant_ptr, dequant_ptr, round_ptr,
                                       log_scale, scan, coeff_count, coeff_ptr,
                                       qcoeff_ptr, dqcoeff_ptr);
  EXPECT_EQ(eob, 2);
  for (int i = 0; i < coeff_count; ++i) {
    EXPECT_EQ(qcoeff_ptr[i], ref_qcoeff_ptr[i]);
    EXPECT_EQ(dqcoeff_ptr[i], ref_dqcoeff_ptr[i]);
  }
}